

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ConnectRequest *
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::attachCounter
          (ConnectRequest *__return_storage_ptr__,ConnectRequest *request,ConnectionCounter *counter
          )

{
  AsyncIoStream *pAVar1;
  PromiseNode *pPVar2;
  Disposer *pDVar3;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_38;
  
  pAVar1 = (request->connection).ptr;
  local_38.disposer = (Disposer *)operator_new(0x20);
  local_38.disposer[1]._vptr_Disposer = (_func_int **)counter->parent;
  counter->parent = (ConcurrencyLimitingHttpClient *)0x0;
  local_38.disposer[2]._vptr_Disposer = (_func_int **)(request->connection).disposer;
  local_38.disposer[3]._vptr_Disposer = (_func_int **)pAVar1;
  (request->connection).ptr = (AsyncIoStream *)0x0;
  local_38.ptr = (AsyncIoStream *)0x1;
  if (pAVar1 != (AsyncIoStream *)0x0) {
    local_38.ptr = pAVar1;
  }
  (local_38.disposer)->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_00593428;
  Own<kj::AsyncIoStream,_std::nullptr_t>::operator=(&request->connection,&local_38);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_38);
  pPVar2 = (request->status).super_PromiseBase.node.ptr;
  pDVar3 = (request->connection).disposer;
  (request->status).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  (__return_storage_ptr__->status).super_PromiseBase.node.ptr = pPVar2;
  (__return_storage_ptr__->connection).disposer = pDVar3;
  (__return_storage_ptr__->connection).ptr = (request->connection).ptr;
  (request->connection).ptr = (AsyncIoStream *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static ConnectRequest attachCounter(
      ConnectRequest&& request,
      ConnectionCounter&& counter) {
    // Notice here that we are only attaching the counter to the connection stream. In the case
    // where the connect tunnel request is rejected and the status promise resolves with an
    // errorBody, there is a possibility that the consuming code might drop the connection stream
    // and the counter while the error body stream is still be consumed. Technically speaking that
    // means we could potentially exceed our concurrency limit temporarily but we consider that
    // acceptable here since the error body is an exception path (plus not requiring that we
    // attach to the errorBody keeps ConnectionCounter from having to be a refcounted heap
    // allocation).
    request.connection = request.connection.attach(kj::mv(counter));
    return kj::mv(request);
  }